

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

int __thiscall
ghc::filesystem::path::compare(path *this,basic_string_view<char,_std::char_traits<char>_> s)

{
  int iVar1;
  path local_40;
  basic_string_view<char,_std::char_traits<char>_> s_local;
  
  s_local._M_str = s._M_str;
  s_local._M_len = s._M_len;
  path<std::basic_string_view<char,std::char_traits<char>>,ghc::filesystem::path>
            (&local_40,&s_local,auto_format);
  iVar1 = std::__cxx11::string::compare((string *)this);
  std::__cxx11::string::~string((string *)&local_40);
  return iVar1;
}

Assistant:

GHC_INLINE int path::compare(std::basic_string_view<value_type> s) const
{
    return native().compare(path(s).native());
}